

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O3

int LS_Sector_SetColor(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                      int arg4)

{
  uint uVar1;
  FSectorTagIterator itr;
  FSectorTagIterator local_38;
  
  if (arg0 == 0) {
    local_38.start = 0;
  }
  else {
    local_38.start = tagManager.TagHashFirst[(ulong)(uint)arg0 & 0xff];
  }
  local_38.searchtag = arg0;
  uVar1 = FSectorTagIterator::Next(&local_38);
  while (-1 < (int)uVar1) {
    sector_t::SetColor(sectors + uVar1,arg1,arg2,arg3,arg4);
    uVar1 = FSectorTagIterator::Next(&local_38);
  }
  return 1;
}

Assistant:

FUNC(LS_Sector_SetColor)
// Sector_SetColor (tag, r, g, b, desaturate)
{
	FSectorTagIterator itr(arg0);
	int secnum;
	while ((secnum = itr.Next()) >= 0)
	{
		sectors[secnum].SetColor(arg1, arg2, arg3, arg4);
	}

	return true;
}